

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::add_function_overload(CompilerGLSL *this,SPIRFunction *func)

{
  bool bVar1;
  uint32_t uVar2;
  pointer ppVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar6;
  key_type local_100 [32];
  _Node_iterator_base<unsigned_long,_false> local_e0;
  undefined1 local_d8;
  _Node_iterator_base<unsigned_long,_false> local_d0;
  undefined1 local_c8;
  key_type local_c0 [32];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_a0;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *overloads;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_true>
  local_80;
  iterator itr;
  string function_name;
  uint64_t local_58;
  uint64_t types_hash;
  SPIRType *type;
  Parameter *pPStack_40;
  uint32_t type_id;
  Parameter *arg;
  Parameter *__end1;
  Parameter *__begin1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range1;
  Hasher hasher;
  SPIRFunction *func_local;
  CompilerGLSL *this_local;
  
  hasher.h = (uint64_t)func;
  Hasher::Hasher((Hasher *)&__range1);
  __begin1 = (Parameter *)(hasher.h + 0x18);
  __end1 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                     ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1);
  arg = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                  ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1);
  for (; __end1 != arg; __end1 = __end1 + 1) {
    pPStack_40 = __end1;
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    type._4_4_ = Compiler::get_pointee_type_id(&this->super_Compiler,uVar2);
    types_hash = (uint64_t)Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type._4_4_);
    bVar1 = VectorView<spirv_cross::CombinedImageSampler>::empty
                      (&(this->super_Compiler).combined_image_samplers.
                        super_VectorView<spirv_cross::CombinedImageSampler>);
    if ((bVar1) ||
       ((*(int *)(types_hash + 0xc) != 0x11 &&
        (((*(int *)(types_hash + 0xc) != 0x10 || (*(int *)(types_hash + 0x104) != 1)) &&
         (*(int *)(types_hash + 0xc) != 0x12)))))) {
      Hasher::u32((Hasher *)&__range1,type._4_4_);
    }
  }
  local_58 = Hasher::get((Hasher *)&__range1);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(hasher.h + 8));
  (*(this->super_Compiler)._vptr_Compiler[6])((key_type *)&itr,this,(ulong)uVar2,1);
  local_80._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
       ::find(&this->function_overloads,(key_type *)&itr);
  overloads = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)::std::
                 end<std::unordered_map<std::__cxx11::string,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>>>>
                           (&this->function_overloads);
  bVar1 = ::std::__detail::operator!=
                    (&local_80,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_true>
                      *)&overloads);
  if (bVar1) {
    ppVar3 = ::std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false,_true>
                           *)&local_80);
    local_a0 = &ppVar3->second;
    sVar4 = ::std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::count(local_a0,&local_58);
    if (sVar4 == 0) {
      pVar6 = ::std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::insert(local_a0,&local_58);
      local_e0._M_cur =
           (__node_type *)pVar6.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
      local_d8 = pVar6.second;
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(hasher.h + 8));
      add_resource_name(this,uVar2);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(hasher.h + 8));
      (*(this->super_Compiler)._vptr_Compiler[6])(local_c0,this,(ulong)uVar2,1);
      pmVar5 = ::std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
               ::operator[](&this->function_overloads,local_c0);
      pVar6 = ::std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::insert(pmVar5,&local_58);
      local_d0._M_cur =
           (__node_type *)pVar6.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
      local_c8 = pVar6.second;
      ::std::__cxx11::string::~string((string *)local_c0);
    }
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(hasher.h + 8));
    add_resource_name(this,uVar2);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(hasher.h + 8));
    (*(this->super_Compiler)._vptr_Compiler[6])(local_100,this,(ulong)uVar2,1);
    pmVar5 = ::std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
             ::operator[](&this->function_overloads,local_100);
    ::std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::insert(pmVar5,&local_58);
    ::std::__cxx11::string::~string((string *)local_100);
  }
  ::std::__cxx11::string::~string((string *)&itr);
  return;
}

Assistant:

void CompilerGLSL::add_function_overload(const SPIRFunction &func)
{
	Hasher hasher;
	for (auto &arg : func.arguments)
	{
		// Parameters can vary with pointer type or not,
		// but that will not change the signature in GLSL/HLSL,
		// so strip the pointer type before hashing.
		uint32_t type_id = get_pointee_type_id(arg.type);
		auto &type = get<SPIRType>(type_id);

		if (!combined_image_samplers.empty())
		{
			// If we have combined image samplers, we cannot really trust the image and sampler arguments
			// we pass down to callees, because they may be shuffled around.
			// Ignore these arguments, to make sure that functions need to differ in some other way
			// to be considered different overloads.
			if (type.basetype == SPIRType::SampledImage ||
			    (type.basetype == SPIRType::Image && type.image.sampled == 1) || type.basetype == SPIRType::Sampler)
			{
				continue;
			}
		}

		hasher.u32(type_id);
	}
	uint64_t types_hash = hasher.get();

	auto function_name = to_name(func.self);
	auto itr = function_overloads.find(function_name);
	if (itr != end(function_overloads))
	{
		// There exists a function with this name already.
		auto &overloads = itr->second;
		if (overloads.count(types_hash) != 0)
		{
			// Overload conflict, assign a new name.
			add_resource_name(func.self);
			function_overloads[to_name(func.self)].insert(types_hash);
		}
		else
		{
			// Can reuse the name.
			overloads.insert(types_hash);
		}
	}
	else
	{
		// First time we see this function name.
		add_resource_name(func.self);
		function_overloads[to_name(func.self)].insert(types_hash);
	}
}